

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unit_misc_tests.cpp
# Opt level: O1

void __thiscall
iu_UnitRandomTest_x_iutest_x_Size64_Test::Body(iu_UnitRandomTest_x_iutest_x_Size64_Test *this)

{
  uint uVar1;
  unsigned_long (*actual) [10];
  uint uVar3;
  unsigned_long (*pauVar4) [10];
  EVP_PKEY_CTX *in_RSI;
  long lVar5;
  AssertionResult iutest_ar;
  UInt64 y [10];
  UInt64 x [10];
  allocator<char> local_2a1;
  Engine local_2a0;
  AssertionResult local_290;
  AssertionHelper local_268;
  unsigned_long local_238 [10];
  ulong local_1e8 [11];
  undefined1 local_190 [392];
  unsigned_long (*pauVar2) [10];
  
  local_2a0.m_v3 = 0x6c078965;
  local_2a0.m_v4 = 0;
  local_2a0.m_v1 = 0x2016830a;
  local_2a0.m_v2 = 0x714acb3e;
  iutest::detail::iuRandom::init((iuRandom *)&local_2a0,in_RSI);
  lVar5 = 0;
  pauVar2 = (unsigned_long (*) [10])(local_2a0._8_8_ & 0xffffffff);
  do {
    uVar3 = local_2a0.m_v4;
    pauVar4 = pauVar2;
    local_2a0.m_v1 = local_2a0.m_v1 << 0xb ^ local_2a0.m_v1;
    uVar1 = local_2a0.m_v1 >> 8 ^ uVar3 >> 0x13 ^ local_2a0.m_v1 ^ uVar3;
    pauVar2 = (unsigned_long (*) [10])(ulong)uVar1;
    local_2a0.m_v2 = local_2a0.m_v2 << 0xb ^ local_2a0.m_v2;
    local_2a0.m_v4 = local_2a0.m_v2 >> 8 ^ local_2a0.m_v2 ^ uVar1 ^ uVar1 >> 0x13;
    local_1e8[lVar5] = (ulong)pauVar2;
    lVar5 = lVar5 + 1;
    local_2a0.m_v1 = (uint)pauVar4;
    local_2a0.m_v2 = uVar3;
  } while (lVar5 != 10);
  lVar5 = 0;
  do {
    local_2a0.m_v2 = local_2a0.m_v4;
    actual = pauVar2;
    uVar1 = (uint)pauVar4 << 0xb ^ (uint)pauVar4;
    local_2a0.m_v3 = uVar1 >> 8 ^ local_2a0.m_v2 >> 0x13 ^ uVar1 ^ local_2a0.m_v2;
    uVar3 = uVar3 << 0xb ^ uVar3;
    local_2a0.m_v4 = uVar3 >> 8 ^ uVar3 ^ local_2a0.m_v3 ^ local_2a0.m_v3 >> 0x13;
    local_238[lVar5] = (unsigned_long)(ulong)local_2a0.m_v3;
    lVar5 = lVar5 + 1;
    pauVar2 = (unsigned_long (*) [10])(ulong)local_2a0.m_v3;
    pauVar4 = actual;
    uVar3 = local_2a0.m_v2;
  } while (lVar5 != 10);
  local_2a0.m_v1 = (uint)actual;
  iuutil::CmpHelperNeRange<unsigned_long[10],unsigned_long[10]>
            (&local_290,(iuutil *)0x171bb8,"y",(char *)local_1e8,&local_238,actual);
  if (local_290.m_result == false) {
    memset((iu_global_format_stringstream *)local_190,0,0x188);
    iutest::iu_global_format_stringstream::iu_global_format_stringstream
              ((iu_global_format_stringstream *)local_190);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_268,local_290.m_message._M_dataplus._M_p,&local_2a1);
    local_268.m_part_result.super_iuCodeMessage.m_file =
         "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/unit_misc_tests.cpp"
    ;
    local_268.m_part_result.super_iuCodeMessage.m_line = 0x44;
    local_268.m_part_result.super_iuCodeMessage._44_4_ = 1;
    iutest::AssertionHelper::OnFixed(&local_268,(Fixed *)local_190,false);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_268.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p !=
        &local_268.m_part_result.super_iuCodeMessage.m_message.field_2) {
      operator_delete(local_268.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p,
                      local_268.m_part_result.super_iuCodeMessage.m_message.field_2.
                      _M_allocated_capacity + 1);
    }
    std::__cxx11::stringstream::~stringstream((stringstream *)local_190);
    std::ios_base::~ios_base((ios_base *)(local_190 + 0x80));
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_290.m_message._M_dataplus._M_p != &local_290.m_message.field_2) {
    operator_delete(local_290.m_message._M_dataplus._M_p,
                    local_290.m_message.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

IUTEST(UnitRandomTest, Size64)
{
    ::iutest::detail::iuRandom r;
    iutest::UInt64 x[10];
    for( int i=0; i < 10; ++i)
    {
        x[i] = r.genrand<iutest::UInt64>() >> 32;
    }
    iutest::UInt64 y[10];
    for( int i=0; i < 10; ++i)
    {
        y[i] = r.genrand<iutest::UInt64>() >> 32;
    }
    IUTEST_EXPECT_NE_RANGE(x, y);
}